

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O3

string * __thiscall
netlist::resolveSymbolHierPath_abi_cxx11_
          (string *__return_storage_ptr__,netlist *this,Symbol *symbol)

{
  string *psVar1;
  string *extraout_RAX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  string newSuffix;
  string oldSuffix;
  string local_68;
  undefined1 local_48 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  psVar1 = slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(__return_storage_ptr__,(Symbol *)this)
  ;
  if (*(int *)this == 0x2d) {
    local_68._M_string_length = *(size_type *)(*(long *)(*(long *)(this + 0x20) + 8) + 8);
    local_68._M_dataplus._M_p = *(pointer *)(*(long *)(*(long *)(this + 0x20) + 8) + 0x10);
    local_68.field_2._8_8_ = *(undefined8 *)(this + 8);
    local_68.field_2._M_allocated_capacity = *(undefined8 *)(this + 0x10);
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x6;
    ::fmt::v11::vformat_abi_cxx11_((string *)local_48,(v11 *)".{}.{}",fmt,args);
    local_28._8_8_ = *(undefined8 *)(this + 8);
    local_28._M_allocated_capacity = *(undefined8 *)(this + 0x10);
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_28;
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x3;
    ::fmt::v11::vformat_abi_cxx11_(&local_68,(v11 *)0x4d2a20,fmt_00,args_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (__return_storage_ptr__,__return_storage_ptr__->_M_string_length - local_48._8_8_,
               local_48._8_8_,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    psVar1 = (string *)(local_48 + 0x10);
    if ((string *)local_48._0_8_ != psVar1) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
      psVar1 = extraout_RAX;
    }
  }
  return psVar1;
}

Assistant:

static std::string resolveSymbolHierPath(const ast::Symbol& symbol) {

    // Resolve the hierarchical path of the symbol.
    auto buffer = symbol.getHierarchicalPath();

    // Is the symbol is a modport, use the modport name to adjust the
    // hierachical path to match the corresponding variable declaration in the
    // interface.
    if (symbol.kind == ast::SymbolKind::ModportPort) {
        auto const& modportSymbol = symbol.getParentScope()->asSymbol();
        auto& modportName = modportSymbol.name;
        auto oldSuffix = fmt::format(".{}.{}", modportSymbol.name, symbol.name);
        auto newSuffix = fmt::format(".{}", symbol.name);
        DEBUG_PRINT("hierPath={}, oldSuffix={}, newSuffix={}\n", buffer, oldSuffix, newSuffix);
        SLANG_ASSERT(buffer.ends_with(oldSuffix));
        buffer.replace(buffer.end() - (ptrdiff_t)oldSuffix.length(), buffer.end(),
                       newSuffix.begin(), newSuffix.end());
    }

    return buffer;
}